

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O0

bool idx2::CreateFullDir(stref *Path)

{
  int iVar1;
  cstr __s;
  char *local_28;
  str P;
  int Error;
  cstr PathCopy;
  stref *Path_local;
  
  __s = ToString(Path);
  for (local_28 = strchr(__s,0x2f); local_28 != (char *)0x0; local_28 = strchr(local_28 + 1,0x2f)) {
    *local_28 = '\0';
    mkdir(__s,0x1db);
    *local_28 = '/';
  }
  iVar1 = mkdir(__s,0x1db);
  return iVar1 == 0;
}

Assistant:

bool
CreateFullDir(const stref& Path)
{
  cstr PathCopy = ToString(Path);
  int Error = 0;
  str P = (str)PathCopy;

  for // loop through the components (between two '/')
  (
    P = (str)strchr(PathCopy, '/');
    P;
    P = (str)strchr(P + 1, '/')
  )
  {
    *P = '\0';
    Error = MkDir(PathCopy);
    *P = '/';
  }

  Error = MkDir(PathCopy);

  return (Error == 0);
}